

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

CharFormat testing::internal::PrintAsStringLiteralTo(wchar_t c,ostream *os)

{
  long lVar1;
  long in_FS_OFFSET;
  ostream *os_local;
  wchar_t c_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (c == L'\"') {
    std::operator<<(os,"\\\"");
    os_local._4_4_ = kSpecialEscape;
  }
  else if (c == L'\'') {
    std::operator<<(os,"\'");
    os_local._4_4_ = kAsIs;
  }
  else {
    os_local._4_4_ = PrintAsCharLiteralTo<wchar_t,wchar_t>(c,os);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return os_local._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

static CharFormat PrintAsStringLiteralTo(wchar_t c, ostream* os) {
  switch (c) {
    case L'\'':
      *os << "'";
      return kAsIs;
    case L'"':
      *os << "\\\"";
      return kSpecialEscape;
    default:
      return PrintAsCharLiteralTo<wchar_t>(c, os);
  }
}